

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_alphamapblit_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  long lVar2;
  uchar *puVar3;
  QT_FT_Span *pQVar4;
  int iVar5;
  uint c;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uchar *puVar10;
  int iVar11;
  quint32 *dest;
  uint uVar12;
  long lVar13;
  ClipLine *pCVar14;
  long in_FS_OFFSET;
  ushort uVar15;
  ushort uVar16;
  QColorTrcLut *local_80;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  c = QRgba64::toArgb32(color);
  if (color->rgba >> 0x30 != 0) {
    uVar7 = rasterBuffer->bytes_per_line;
    if (useGammaCorrection) {
      local_80 = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
      local_40 = (QRgba64)color->rgba;
      if (local_80 == (QColorTrcLut *)0x0) {
        local_80 = (QColorTrcLut *)0x0;
      }
      else if ((short)(local_40.rgba >> 0x30) == -1) {
        _Var1._M_head_impl =
             (local_80->m_toLinear)._M_t.
             super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
             super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
        uVar15 = (ushort)(local_40.rgba >> 0x10);
        uVar16 = (ushort)(local_40.rgba >> 0x20);
        local_40.rgba =
             CONCAT26(0xffff,CONCAT24((_Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4] >>
                                      8) + _Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4]
                                      ,CONCAT22((_Var1._M_head_impl
                                                 [(ushort)(uVar15 - (uVar15 >> 8)) >> 4] >> 8) +
                                                _Var1._M_head_impl
                                                [(ushort)(uVar15 - (uVar15 >> 8)) >> 4],
                                                (_Var1._M_head_impl
                                                 [(ushort)((ushort)local_40.rgba -
                                                          ((ushort)local_40.rgba >> 8)) >> 4] >> 8)
                                                + _Var1._M_head_impl
                                                  [(ushort)((ushort)local_40.rgba -
                                                           ((ushort)local_40.rgba >> 8)) >> 4])));
      }
    }
    else {
      local_80 = (QColorTrcLut *)0x0;
      local_40.rgba = color->rgba;
    }
    if (clip == (QClipData *)0x0) {
      if (0 < mapHeight) {
        dest = (quint32 *)
               (rasterBuffer->m_buffer + (long)x * 4 + (long)y * rasterBuffer->bytes_per_line);
        uVar12 = mapHeight + 1;
        do {
          qt_alphamapblit_argb32_oneline(map,mapWidth,&local_40,dest,c,local_80);
          map = map + mapStride;
          uVar12 = uVar12 - 1;
          dest = dest + (int)(uVar7 >> 2);
        } while (1 < uVar12);
      }
    }
    else {
      uVar12 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        uVar12 = rasterBuffer->m_height;
      }
      uVar8 = 0;
      if (0 < y) {
        uVar8 = y;
      }
      QClipData::initialize(clip);
      if ((int)uVar8 < (int)uVar12) {
        uVar7 = (ulong)uVar8;
        puVar10 = map + (int)((uVar8 - y) * mapStride);
        do {
          if (0 < clip->m_clipLines[uVar7].count) {
            lVar2 = rasterBuffer->bytes_per_line;
            puVar3 = rasterBuffer->m_buffer;
            pCVar14 = clip->m_clipLines + uVar7;
            lVar13 = 4;
            lVar9 = 0;
            do {
              pQVar4 = pCVar14->spans;
              iVar6 = *(int *)((long)pQVar4 + lVar13 + -4);
              iVar5 = x;
              if (x < iVar6) {
                iVar5 = iVar6;
              }
              iVar6 = iVar6 + *(int *)((long)&pQVar4->x + lVar13);
              iVar11 = mapWidth + x;
              if (iVar6 <= mapWidth + x) {
                iVar11 = iVar6;
              }
              qt_alphamapblit_argb32_oneline
                        (puVar10 + ((long)iVar5 - (long)x),iVar11 - iVar5,&local_40,
                         (quint32 *)(puVar3 + (long)iVar5 * 4 + lVar2 * uVar7),c,local_80);
              lVar9 = lVar9 + 1;
              lVar13 = lVar13 + 0x10;
            } while (lVar9 < pCVar14->count);
          }
          puVar10 = puVar10 + mapStride;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar12);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride,
                                   const QClipData *clip, bool useGammaCorrection)
{
    const quint32 c = color.toArgb32();
    const int destStride = rasterBuffer->stride<quint32>();

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    if (!clip) {
        quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y)) + x;
        while (--mapHeight >= 0) {
            qt_alphamapblit_argb32_oneline(map, mapWidth, srcColor, dest, c, colorProfile);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint32 *dest = reinterpret_cast<quint32 *>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];
                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                qt_alphamapblit_argb32_oneline(map + start - x, end - start, srcColor, dest + start, c, colorProfile);
            } // for (yp -> bottom)
            map += mapStride;
        }
    }
}